

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O2

Offset<void> __thiscall
CharacterUnion::Pack(CharacterUnion *this,FlatBufferBuilder *_fbb,rehasher_function_t *_rehasher)

{
  Offset<const_BookReader_*> OVar1;
  Offset<flatbuffers::String> OVar2;
  Offset<Attacker> OVar3;
  Offset<const_Rapunzel_*> OVar4;
  
  switch(this->type) {
  case Character_MuLan:
    OVar3 = CreateAttacker(_fbb,*this->value);
    return (Offset<void>)OVar3.o;
  case Character_Rapunzel:
    OVar4 = flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<Rapunzel>
                      (_fbb,(Rapunzel *)this->value);
    return (Offset<void>)OVar4.o;
  case Character_Belle:
  case Character_BookFan:
    OVar1 = flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<BookReader>
                      (_fbb,(BookReader *)this->value);
    return (Offset<void>)OVar1.o;
  case Character_Other:
  case Character_MAX:
    OVar2 = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                      (_fbb,(string *)this->value);
    return (Offset<void>)OVar2.o;
  default:
    return (Offset<void>)0;
  }
}

Assistant:

inline ::flatbuffers::Offset<void> CharacterUnion::Pack(::flatbuffers::FlatBufferBuilder &_fbb, const ::flatbuffers::rehasher_function_t *_rehasher) const {
  (void)_rehasher;
  switch (type) {
    case Character_MuLan: {
      auto ptr = reinterpret_cast<const AttackerT *>(value);
      return CreateAttacker(_fbb, ptr, _rehasher).Union();
    }
    case Character_Rapunzel: {
      auto ptr = reinterpret_cast<const Rapunzel *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_Belle: {
      auto ptr = reinterpret_cast<const BookReader *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_BookFan: {
      auto ptr = reinterpret_cast<const BookReader *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_Other: {
      auto ptr = reinterpret_cast<const std::string *>(value);
      return _fbb.CreateString(*ptr).Union();
    }
    case Character_Unused: {
      auto ptr = reinterpret_cast<const std::string *>(value);
      return _fbb.CreateString(*ptr).Union();
    }
    default: return 0;
  }
}